

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_true,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  byte bVar2;
  BVH *bvh;
  void *pvVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  vbool<4> vVar15;
  char cVar16;
  bool bVar17;
  uint uVar18;
  undefined4 uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  NodeRef root;
  size_t sVar24;
  size_t sVar25;
  ulong uVar26;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  NodeRef *pNVar28;
  undefined1 in_ZMM0 [64];
  vint4 ai_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  vint4 ai_3;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  vint4 ai;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vint4 bi;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 bi_1;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar72;
  float fVar73;
  vint4 bi_3;
  float fVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 ai_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vfloat4 a0;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [64];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  
  uVar14 = mm_lookupmask_ps._8_8_;
  uVar13 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar25 = (bvh->root).ptr;
  if (sVar25 != 8) {
    auVar37 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar45 = vpcmpeqd_avx(auVar37,(undefined1  [16])valid_i->field_0);
    auVar37 = *(undefined1 (*) [16])(ray + 0x80);
    auVar29 = ZEXT816(0) << 0x40;
    auVar40 = vcmpps_avx(auVar37,auVar29,5);
    auVar40 = vandps_avx(auVar40,auVar45);
    uVar21 = vmovmskps_avx(auVar40);
    if (uVar21 != 0) {
      uVar22 = (ulong)(uVar21 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar45._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar45._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar45._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar45._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar45 = vfmadd231ps_fma(auVar45,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar60 = vfmadd231ps_fma(auVar45,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar45 = vrsqrtps_avx(auVar60);
      fVar66 = auVar45._0_4_;
      fVar72 = auVar45._4_4_;
      fVar73 = auVar45._8_4_;
      fVar74 = auVar45._12_4_;
      auVar59._0_4_ = fVar66 * fVar66 * fVar66 * auVar60._0_4_ * -0.5;
      auVar59._4_4_ = fVar72 * fVar72 * fVar72 * auVar60._4_4_ * -0.5;
      auVar59._8_4_ = fVar73 * fVar73 * fVar73 * auVar60._8_4_ * -0.5;
      auVar59._12_4_ = fVar74 * fVar74 * fVar74 * auVar60._12_4_ * -0.5;
      auVar75._8_4_ = 0x3fc00000;
      auVar75._0_8_ = 0x3fc000003fc00000;
      auVar75._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar75,auVar45,auVar59);
      auVar60._8_4_ = 0x80000000;
      auVar60._0_8_ = 0x8000000080000000;
      auVar60._12_4_ = 0x80000000;
      do {
        lVar23 = 0;
        for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          lVar23 = lVar23 + 1;
        }
        uVar26 = (ulong)(uint)((int)lVar23 * 4);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar26 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar26 + 0x50)),0x1c);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + uVar26 + 0x60)),0x28);
        fVar66 = *(float *)((long)pre.ray_space + (uVar26 - 0x10));
        auVar83._0_4_ = auVar45._0_4_ * fVar66;
        auVar83._4_4_ = auVar45._4_4_ * fVar66;
        auVar83._8_4_ = auVar45._8_4_ * fVar66;
        auVar83._12_4_ = auVar45._12_4_ * fVar66;
        auVar59 = vshufpd_avx(auVar83,auVar83,1);
        auVar45 = vmovshdup_avx(auVar83);
        auVar89._0_4_ = auVar45._0_4_ ^ 0x80000000;
        auVar45 = vunpckhps_avx(auVar83,auVar29);
        auVar89._4_12_ = ZEXT812(0) << 0x20;
        auVar86._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
        auVar86._8_8_ = auVar59._8_8_ ^ auVar60._8_8_;
        auVar75 = vinsertps_avx(auVar86,auVar83,0x2a);
        auVar79 = vshufps_avx(auVar45,auVar89,0x41);
        auVar45 = vdpps_avx(auVar75,auVar75,0x7f);
        auVar59 = vdpps_avx(auVar79,auVar79,0x7f);
        auVar45 = vcmpps_avx(auVar45,auVar59,1);
        auVar92._0_4_ = auVar45._0_4_;
        auVar92._4_4_ = auVar92._0_4_;
        auVar92._8_4_ = auVar92._0_4_;
        auVar92._12_4_ = auVar92._0_4_;
        auVar45 = vblendvps_avx(auVar75,auVar79,auVar92);
        auVar59 = vdpps_avx(auVar45,auVar45,0x7f);
        auVar75 = vrsqrtss_avx(auVar59,auVar59);
        fVar72 = auVar75._0_4_;
        fVar72 = fVar72 * 1.5 - auVar59._0_4_ * 0.5 * fVar72 * fVar72 * fVar72;
        auVar87._0_4_ = auVar45._0_4_ * fVar72;
        auVar87._4_4_ = auVar45._4_4_ * fVar72;
        auVar87._8_4_ = auVar45._8_4_ * fVar72;
        auVar87._12_4_ = auVar45._12_4_ * fVar72;
        auVar45 = vshufps_avx(auVar87,auVar87,0xc9);
        auVar59 = vshufps_avx(auVar83,auVar83,0xc9);
        auVar93._0_4_ = auVar87._0_4_ * auVar59._0_4_;
        auVar93._4_4_ = auVar87._4_4_ * auVar59._4_4_;
        auVar93._8_4_ = auVar87._8_4_ * auVar59._8_4_;
        auVar93._12_4_ = auVar87._12_4_ * auVar59._12_4_;
        auVar45 = vfmsub231ps_fma(auVar93,auVar83,auVar45);
        auVar75 = vshufps_avx(auVar45,auVar45,0xc9);
        auVar45 = vdpps_avx(auVar75,auVar75,0x7f);
        auVar59 = vrsqrtss_avx(auVar45,auVar45);
        fVar72 = auVar59._0_4_;
        fVar72 = fVar72 * 1.5 - auVar45._0_4_ * 0.5 * fVar72 * fVar72 * fVar72;
        uVar22 = uVar22 - 1 & uVar22;
        auVar90._0_4_ = fVar72 * auVar75._0_4_;
        auVar90._4_4_ = fVar72 * auVar75._4_4_;
        auVar90._8_4_ = fVar72 * auVar75._8_4_;
        auVar90._12_4_ = fVar72 * auVar75._12_4_;
        auVar79._0_4_ = fVar66 * auVar83._0_4_;
        auVar79._4_4_ = fVar66 * auVar83._4_4_;
        auVar79._8_4_ = fVar66 * auVar83._8_4_;
        auVar79._12_4_ = fVar66 * auVar83._12_4_;
        auVar75 = vunpcklps_avx(auVar87,auVar79);
        auVar45 = vunpckhps_avx(auVar87,auVar79);
        auVar79 = vunpcklps_avx(auVar90,auVar29);
        auVar59 = vunpckhps_avx(auVar90,auVar29);
        aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar45,auVar59);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar75,auVar79);
        aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar75,auVar79);
        pre.ray_space[lVar23].vx.field_0 = aVar6;
        pre.ray_space[lVar23].vy.field_0 = aVar4;
        pre.ray_space[lVar23].vz.field_0 = aVar5;
      } while (uVar22 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      auVar45 = vandps_avx(auVar91,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar95 = ZEXT1664(auVar94);
      auVar29 = vcmpps_avx(auVar45,auVar94,1);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = 0x3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar97 = ZEXT1664(auVar96);
      auVar59 = vdivps_avx(auVar96,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar45 = vandps_avx(auVar91,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar60 = vcmpps_avx(auVar45,auVar94,1);
      auVar75 = vdivps_avx(auVar96,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar45 = vandps_avx(auVar91,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar45 = vcmpps_avx(auVar45,auVar94,1);
      auVar76._8_4_ = 0x5d5e0b6b;
      auVar76._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar76._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar59,auVar76,auVar29);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar75,auVar76,auVar60);
      auVar29 = vdivps_avx(auVar96,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar29,auVar76,auVar45);
      auVar29 = ZEXT816(0) << 0x20;
      auVar45 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar29,1);
      auVar61._8_4_ = 0x20;
      auVar61._0_8_ = 0x2000000020;
      auVar61._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar45,auVar61);
      auVar45 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar29,5);
      auVar62._8_4_ = 0x40;
      auVar62._0_8_ = 0x4000000040;
      auVar62._12_4_ = 0x40;
      auVar67._8_4_ = 0x60;
      auVar67._0_8_ = 0x6000000060;
      auVar67._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar67,auVar62,auVar45);
      auVar45 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar29,5);
      auVar42._8_4_ = 0x80;
      auVar42._0_8_ = 0x8000000080;
      auVar42._12_4_ = 0x80;
      auVar50._8_4_ = 0xa0;
      auVar50._0_8_ = 0xa0000000a0;
      auVar50._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar50,auVar42,auVar45);
      auVar45 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar29);
      auVar37 = vmaxps_avx(auVar37,auVar29);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar98 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar45,auVar40);
      auVar29._8_4_ = 0xff800000;
      auVar29._0_8_ = 0xff800000ff800000;
      auVar29._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar29,auVar37,auVar40);
      auVar37 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0.i[1] = auVar40._4_4_ ^ auVar37._4_4_;
      terminated.field_0.i[0] = auVar40._0_4_ ^ auVar37._0_4_;
      terminated.field_0.i[2] = auVar40._8_4_ ^ auVar37._8_4_;
      terminated.field_0.i[3] = auVar40._12_4_ ^ auVar37._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar21 = 3;
      }
      else {
        uVar21 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar27 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar25;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_005b3f61:
      do {
        do {
          root.ptr = pNVar28[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_005b4556;
          pNVar28 = pNVar28 + -1;
          paVar27 = paVar27 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar27->v;
          auVar41 = ZEXT1664((undefined1  [16])vVar1.field_0);
          auVar37 = vcmpps_avx((undefined1  [16])vVar1.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar18 = vmovmskps_avx(auVar37);
        } while (uVar18 == 0);
        uVar22 = (ulong)(uVar18 & 0xff);
        uVar18 = POPCOUNT(uVar18 & 0xff);
        if (uVar21 < uVar18) {
LAB_005b3f9f:
          do {
            vVar15.field_0 = terminated.field_0;
            iVar20 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005b4556;
              auVar37 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar41._0_16_,6);
              if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar37[0xf] < '\0') {
                bVar2 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar3 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar14;
                valid_o.field_0._0_8_ = uVar13;
                uVar18 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                if ((uVar18 ^ 0xf) != 0) {
                  uVar22 = (ulong)((uVar18 ^ 0xf) & 0xff);
                  do {
                    lVar23 = 0;
                    for (uVar26 = uVar22; (uVar26 & 1) == 0;
                        uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                      lVar23 = lVar23 + 1;
                    }
                    cVar16 = (**(code **)((long)pvVar3 + (ulong)bVar2 * 0x40 + 0x18))
                                       (&pre,ray,lVar23,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar16 != '\0') {
                      valid_o.field_0.i[lVar23] = -1;
                    }
                    uVar22 = uVar22 - 1 & uVar22;
                  } while (uVar22 != 0);
                  auVar95 = ZEXT1664(CONCAT412(0x219392ef,CONCAT48(0x219392ef,0x219392ef219392ef)));
                  auVar97 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
                  auVar98 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])valid_o.field_0,(undefined1  [16])vVar15.field_0);
                auVar37 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar37[0xf]) goto LAB_005b4556;
                auVar49._8_4_ = 0xff800000;
                auVar49._0_8_ = 0xff800000ff800000;
                auVar49._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar49,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_005b3f61;
            }
            uVar22 = root.ptr & 0xfffffffffffffff0;
            lVar23 = 0x38;
            sVar25 = 8;
            auVar37 = auVar98._0_16_;
            do {
              sVar24 = *(size_t *)((uVar22 - 0x1c0) + lVar23 * 8);
              if (sVar24 == 8) {
                auVar41 = ZEXT1664(auVar37);
                sVar24 = sVar25;
                break;
              }
              if ((root.ptr & 7) == 0) {
                uVar19 = *(undefined4 *)((root.ptr - 0xa0) + lVar23 * 4);
                auVar30._4_4_ = uVar19;
                auVar30._0_4_ = uVar19;
                auVar30._8_4_ = uVar19;
                auVar30._12_4_ = uVar19;
                auVar7._8_8_ = tray.org.field_0._8_8_;
                auVar7._0_8_ = tray.org.field_0._0_8_;
                auVar9._8_8_ = tray.org.field_0._24_8_;
                auVar9._0_8_ = tray.org.field_0._16_8_;
                auVar11._8_8_ = tray.org.field_0._40_8_;
                auVar11._0_8_ = tray.org.field_0._32_8_;
                auVar45 = vsubps_avx(auVar30,auVar7);
                auVar68._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar45._0_4_;
                auVar68._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar45._4_4_;
                auVar68._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar45._8_4_;
                auVar68._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar45._12_4_;
                uVar19 = *(undefined4 *)((root.ptr - 0x60) + lVar23 * 4);
                auVar31._4_4_ = uVar19;
                auVar31._0_4_ = uVar19;
                auVar31._8_4_ = uVar19;
                auVar31._12_4_ = uVar19;
                auVar45 = vsubps_avx(auVar31,auVar9);
                auVar80._0_4_ = tray.rdir.field_0._16_4_ * auVar45._0_4_;
                auVar80._4_4_ = tray.rdir.field_0._20_4_ * auVar45._4_4_;
                auVar80._8_4_ = tray.rdir.field_0._24_4_ * auVar45._8_4_;
                auVar80._12_4_ = tray.rdir.field_0._28_4_ * auVar45._12_4_;
                uVar19 = *(undefined4 *)((root.ptr - 0x20) + lVar23 * 4);
                auVar32._4_4_ = uVar19;
                auVar32._0_4_ = uVar19;
                auVar32._8_4_ = uVar19;
                auVar32._12_4_ = uVar19;
                auVar45 = vsubps_avx(auVar32,auVar11);
                auVar88._0_4_ = tray.rdir.field_0._32_4_ * auVar45._0_4_;
                auVar88._4_4_ = tray.rdir.field_0._36_4_ * auVar45._4_4_;
                auVar88._8_4_ = tray.rdir.field_0._40_4_ * auVar45._8_4_;
                auVar88._12_4_ = tray.rdir.field_0._44_4_ * auVar45._12_4_;
                uVar19 = *(undefined4 *)((root.ptr - 0x80) + lVar23 * 4);
                auVar33._4_4_ = uVar19;
                auVar33._0_4_ = uVar19;
                auVar33._8_4_ = uVar19;
                auVar33._12_4_ = uVar19;
                auVar45 = vsubps_avx(auVar33,auVar7);
                auVar43._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar45._0_4_;
                auVar43._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar45._4_4_;
                auVar43._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar45._8_4_;
                auVar43._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar45._12_4_;
                uVar19 = *(undefined4 *)((root.ptr - 0x40) + lVar23 * 4);
                auVar34._4_4_ = uVar19;
                auVar34._0_4_ = uVar19;
                auVar34._8_4_ = uVar19;
                auVar34._12_4_ = uVar19;
                auVar45 = vsubps_avx(auVar34,auVar9);
                auVar51._0_4_ = tray.rdir.field_0._16_4_ * auVar45._0_4_;
                auVar51._4_4_ = tray.rdir.field_0._20_4_ * auVar45._4_4_;
                auVar51._8_4_ = tray.rdir.field_0._24_4_ * auVar45._8_4_;
                auVar51._12_4_ = tray.rdir.field_0._28_4_ * auVar45._12_4_;
                uVar19 = *(undefined4 *)(root.ptr + lVar23 * 4);
                auVar35._4_4_ = uVar19;
                auVar35._0_4_ = uVar19;
                auVar35._8_4_ = uVar19;
                auVar35._12_4_ = uVar19;
                auVar45 = vsubps_avx(auVar35,auVar11);
                auVar55._0_4_ = tray.rdir.field_0._32_4_ * auVar45._0_4_;
                auVar55._4_4_ = tray.rdir.field_0._36_4_ * auVar45._4_4_;
                auVar55._8_4_ = tray.rdir.field_0._40_4_ * auVar45._8_4_;
                auVar55._12_4_ = tray.rdir.field_0._44_4_ * auVar45._12_4_;
                auVar45 = vminps_avx(auVar68,auVar43);
                auVar29 = vminps_avx(auVar80,auVar51);
                auVar45 = vmaxps_avx(auVar45,auVar29);
                auVar29 = vminps_avx(auVar88,auVar55);
                auVar45 = vmaxps_avx(auVar45,auVar29);
                auVar36._0_4_ = auVar45._0_4_ * 0.99999964;
                auVar36._4_4_ = auVar45._4_4_ * 0.99999964;
                auVar36._8_4_ = auVar45._8_4_ * 0.99999964;
                auVar36._12_4_ = auVar45._12_4_ * 0.99999964;
                auVar45 = vmaxps_avx(auVar68,auVar43);
                auVar29 = vmaxps_avx(auVar80,auVar51);
                auVar29 = vminps_avx(auVar45,auVar29);
                auVar45 = vmaxps_avx(auVar88,auVar55);
                auVar29 = vminps_avx(auVar29,auVar45);
                auVar45 = vmaxps_avx(auVar36,(undefined1  [16])tray.tnear.field_0);
                auVar44._0_4_ = auVar29._0_4_ * 1.0000004;
                auVar44._4_4_ = auVar29._4_4_ * 1.0000004;
                auVar44._8_4_ = auVar29._8_4_ * 1.0000004;
                auVar44._12_4_ = auVar29._12_4_ * 1.0000004;
                auVar29 = vminps_avx(auVar44,(undefined1  [16])tray.tfar.field_0);
              }
              else {
                uVar19 = *(undefined4 *)((uVar22 - 0x40) + lVar23 * 4);
                auVar69._4_4_ = uVar19;
                auVar69._0_4_ = uVar19;
                auVar69._8_4_ = uVar19;
                auVar69._12_4_ = uVar19;
                uVar19 = *(undefined4 *)((uVar22 - 0x20) + lVar23 * 4);
                auVar63._4_4_ = uVar19;
                auVar63._0_4_ = uVar19;
                auVar63._8_4_ = uVar19;
                auVar63._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(uVar22 + lVar23 * 4);
                auVar56._4_4_ = uVar19;
                auVar56._0_4_ = uVar19;
                auVar56._8_4_ = uVar19;
                auVar56._12_4_ = uVar19;
                fVar66 = *(float *)(uVar22 + 0x20 + lVar23 * 4);
                auVar77._4_4_ = fVar66;
                auVar77._0_4_ = fVar66;
                auVar77._8_4_ = fVar66;
                auVar77._12_4_ = fVar66;
                fVar72 = *(float *)(uVar22 + 0x40 + lVar23 * 4);
                auVar81._4_4_ = fVar72;
                auVar81._0_4_ = fVar72;
                auVar81._8_4_ = fVar72;
                auVar81._12_4_ = fVar72;
                fVar73 = *(float *)(uVar22 + 0x60 + lVar23 * 4);
                auVar84._4_4_ = fVar73;
                auVar84._0_4_ = fVar73;
                auVar84._8_4_ = fVar73;
                auVar84._12_4_ = fVar73;
                uVar19 = *(undefined4 *)(uVar22 + 0x80 + lVar23 * 4);
                auVar53._4_4_ = uVar19;
                auVar53._0_4_ = uVar19;
                auVar53._8_4_ = uVar19;
                auVar53._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(uVar22 + 0xa0 + lVar23 * 4);
                auVar38._4_4_ = uVar19;
                auVar38._0_4_ = uVar19;
                auVar38._8_4_ = uVar19;
                auVar38._12_4_ = uVar19;
                uVar19 = *(undefined4 *)(uVar22 + 0xc0 + lVar23 * 4);
                auVar46._4_4_ = uVar19;
                auVar46._0_4_ = uVar19;
                auVar46._8_4_ = uVar19;
                auVar46._12_4_ = uVar19;
                auVar12._8_8_ = tray.org.field_0._40_8_;
                auVar12._0_8_ = tray.org.field_0._32_8_;
                auVar45 = vfmadd231ps_fma(auVar53,auVar12,auVar77);
                auVar29 = vfmadd231ps_fma(auVar38,auVar12,auVar81);
                auVar60 = vfmadd231ps_fma(auVar46,auVar12,auVar84);
                auVar78._0_4_ = (float)tray.dir.field_0._32_4_ * fVar66;
                auVar78._4_4_ = (float)tray.dir.field_0._36_4_ * fVar66;
                auVar78._8_4_ = (float)tray.dir.field_0._40_4_ * fVar66;
                auVar78._12_4_ = (float)tray.dir.field_0._44_4_ * fVar66;
                auVar82._0_4_ = fVar72 * (float)tray.dir.field_0._32_4_;
                auVar82._4_4_ = fVar72 * (float)tray.dir.field_0._36_4_;
                auVar82._8_4_ = fVar72 * (float)tray.dir.field_0._40_4_;
                auVar82._12_4_ = fVar72 * (float)tray.dir.field_0._44_4_;
                auVar85._0_4_ = fVar73 * (float)tray.dir.field_0._32_4_;
                auVar85._4_4_ = fVar73 * (float)tray.dir.field_0._36_4_;
                auVar85._8_4_ = fVar73 * (float)tray.dir.field_0._40_4_;
                auVar85._12_4_ = fVar73 * (float)tray.dir.field_0._44_4_;
                auVar59 = vfmadd231ps_fma(auVar78,(undefined1  [16])
                                                  tray.dir.field_0.field_0.y.field_0,auVar69);
                auVar75 = vfmadd231ps_fma(auVar82,(undefined1  [16])
                                                  tray.dir.field_0.field_0.y.field_0,auVar63);
                auVar79 = vfmadd231ps_fma(auVar85,auVar56,
                                          (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar10._8_8_ = tray.org.field_0._24_8_;
                auVar10._0_8_ = tray.org.field_0._16_8_;
                auVar83 = vfmadd231ps_fma(auVar45,auVar10,auVar69);
                uVar19 = *(undefined4 *)((uVar22 - 0xa0) + lVar23 * 4);
                auVar70._4_4_ = uVar19;
                auVar70._0_4_ = uVar19;
                auVar70._8_4_ = uVar19;
                auVar70._12_4_ = uVar19;
                auVar86 = vfmadd231ps_fma(auVar29,auVar10,auVar63);
                uVar19 = *(undefined4 *)((uVar22 - 0x80) + lVar23 * 4);
                auVar64._4_4_ = uVar19;
                auVar64._0_4_ = uVar19;
                auVar64._8_4_ = uVar19;
                auVar64._12_4_ = uVar19;
                auVar87 = vfmadd231ps_fma(auVar60,auVar10,auVar56);
                uVar19 = *(undefined4 *)((uVar22 - 0x60) + lVar23 * 4);
                auVar57._4_4_ = uVar19;
                auVar57._0_4_ = uVar19;
                auVar57._8_4_ = uVar19;
                auVar57._12_4_ = uVar19;
                auVar29 = vfmadd231ps_fma(auVar59,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar70);
                auVar60 = vfmadd231ps_fma(auVar75,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar64);
                auVar59 = vfmadd231ps_fma(auVar79,auVar57,
                                          (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar45 = vandps_avx(auVar91,auVar29);
                auVar75 = auVar95._0_16_;
                auVar45 = vcmpps_avx(auVar45,auVar75,1);
                auVar29 = vblendvps_avx(auVar29,auVar75,auVar45);
                auVar45 = vandps_avx(auVar60,auVar91);
                auVar45 = vcmpps_avx(auVar45,auVar75,1);
                auVar60 = vblendvps_avx(auVar60,auVar75,auVar45);
                auVar45 = vandps_avx(auVar59,auVar91);
                auVar45 = vcmpps_avx(auVar45,auVar75,1);
                auVar45 = vblendvps_avx(auVar59,auVar75,auVar45);
                auVar59 = vrcpps_avx(auVar29);
                auVar75 = auVar97._0_16_;
                auVar29 = vfnmadd213ps_fma(auVar29,auVar59,auVar75);
                auVar59 = vfmadd132ps_fma(auVar29,auVar59,auVar59);
                auVar29 = vrcpps_avx(auVar60);
                auVar60 = vfnmadd213ps_fma(auVar60,auVar29,auVar75);
                auVar60 = vfmadd132ps_fma(auVar60,auVar29,auVar29);
                auVar29 = vrcpps_avx(auVar45);
                auVar45 = vfnmadd213ps_fma(auVar45,auVar29,auVar75);
                auVar45 = vfmadd132ps_fma(auVar45,auVar29,auVar29);
                auVar8._8_8_ = tray.org.field_0._8_8_;
                auVar8._0_8_ = tray.org.field_0._0_8_;
                auVar29 = vfmadd231ps_fma(auVar83,auVar8,auVar70);
                auVar75 = vfmadd231ps_fma(auVar86,auVar8,auVar64);
                auVar79 = vfmadd231ps_fma(auVar87,auVar8,auVar57);
                auVar54._0_4_ = auVar29._0_4_ * -auVar59._0_4_;
                auVar54._4_4_ = auVar29._4_4_ * -auVar59._4_4_;
                auVar54._8_4_ = auVar29._8_4_ * -auVar59._8_4_;
                auVar54._12_4_ = auVar29._12_4_ * -auVar59._12_4_;
                auVar39._0_4_ = auVar75._0_4_ * -auVar60._0_4_;
                auVar39._4_4_ = auVar75._4_4_ * -auVar60._4_4_;
                auVar39._8_4_ = auVar75._8_4_ * -auVar60._8_4_;
                auVar39._12_4_ = auVar75._12_4_ * -auVar60._12_4_;
                auVar47._0_4_ = auVar79._0_4_ * -auVar45._0_4_;
                auVar47._4_4_ = auVar79._4_4_ * -auVar45._4_4_;
                auVar47._8_4_ = auVar79._8_4_ * -auVar45._8_4_;
                auVar47._12_4_ = auVar79._12_4_ * -auVar45._12_4_;
                auVar58._0_4_ = auVar59._0_4_ + auVar54._0_4_;
                auVar58._4_4_ = auVar59._4_4_ + auVar54._4_4_;
                auVar58._8_4_ = auVar59._8_4_ + auVar54._8_4_;
                auVar58._12_4_ = auVar59._12_4_ + auVar54._12_4_;
                auVar65._0_4_ = auVar60._0_4_ + auVar39._0_4_;
                auVar65._4_4_ = auVar60._4_4_ + auVar39._4_4_;
                auVar65._8_4_ = auVar60._8_4_ + auVar39._8_4_;
                auVar65._12_4_ = auVar60._12_4_ + auVar39._12_4_;
                auVar71._0_4_ = auVar45._0_4_ + auVar47._0_4_;
                auVar71._4_4_ = auVar45._4_4_ + auVar47._4_4_;
                auVar71._8_4_ = auVar45._8_4_ + auVar47._8_4_;
                auVar71._12_4_ = auVar45._12_4_ + auVar47._12_4_;
                auVar45 = vpminsd_avx(auVar54,auVar58);
                auVar29 = vpminsd_avx(auVar39,auVar65);
                auVar45 = vpmaxsd_avx(auVar45,auVar29);
                auVar29 = vpminsd_avx(auVar47,auVar71);
                auVar45 = vpmaxsd_avx(auVar45,auVar29);
                auVar29 = vpmaxsd_avx(auVar54,auVar58);
                auVar60 = vpmaxsd_avx(auVar39,auVar65);
                auVar60 = vpminsd_avx(auVar29,auVar60);
                auVar29 = vpmaxsd_avx(auVar47,auVar71);
                auVar29 = vpminsd_avx(auVar60,auVar29);
                auVar36._0_4_ = auVar45._0_4_ * 0.99999964;
                auVar36._4_4_ = auVar45._4_4_ * 0.99999964;
                auVar36._8_4_ = auVar45._8_4_ * 0.99999964;
                auVar36._12_4_ = auVar45._12_4_ * 0.99999964;
                auVar45 = vpmaxsd_avx(auVar36,(undefined1  [16])tray.tnear.field_0);
                auVar48._0_4_ = auVar29._0_4_ * 1.0000004;
                auVar48._4_4_ = auVar29._4_4_ * 1.0000004;
                auVar48._8_4_ = auVar29._8_4_ * 1.0000004;
                auVar48._12_4_ = auVar29._12_4_ * 1.0000004;
                auVar29 = vpminsd_avx(auVar48,(undefined1  [16])tray.tfar.field_0);
              }
              auVar45 = vcmpps_avx(auVar45,auVar29,2);
              auVar52._8_8_ = 0x100000001;
              auVar52._0_8_ = 0x100000001;
              if ((auVar52 & auVar45) == (undefined1  [16])0x0) {
                auVar41 = ZEXT1664(auVar37);
                sVar24 = sVar25;
              }
              else {
                auVar45 = vpslld_avx(auVar45,0x1f);
                auVar45 = vblendvps_avx(auVar98._0_16_,auVar36,auVar45);
                auVar41 = ZEXT1664(auVar45);
                if (sVar25 != 8) {
                  pNVar28->ptr = sVar25;
                  pNVar28 = pNVar28 + 1;
                  *(undefined1 (*) [16])paVar27->v = auVar37;
                  paVar27 = paVar27 + 1;
                }
              }
              lVar23 = lVar23 + 1;
              auVar37 = auVar41._0_16_;
              sVar25 = sVar24;
            } while (lVar23 != 0x40);
            if (sVar24 == 8) goto LAB_005b4329;
            auVar37 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar41._0_16_,6);
            uVar19 = vmovmskps_avx(auVar37);
            root.ptr = sVar24;
          } while ((byte)uVar21 < (byte)POPCOUNT(uVar19));
          pNVar28->ptr = sVar24;
          pNVar28 = pNVar28 + 1;
          *paVar27 = auVar41._0_16_;
          paVar27 = paVar27 + 1;
        }
        else {
          do {
            sVar25 = 0;
            for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar25 = sVar25 + 1;
            }
            bVar17 = occluded1(This,bvh,root,sVar25,&pre,ray,&tray,context);
            if (bVar17) {
              terminated.field_0.i[sVar25] = -1;
            }
            uVar22 = uVar22 - 1 & uVar22;
          } while (uVar22 != 0);
          auVar37 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar20 = 3;
          if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar37[0xf] < '\0') {
            auVar37._8_4_ = 0xff800000;
            auVar37._0_8_ = 0xff800000ff800000;
            auVar37._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar37,
                               (undefined1  [16])terminated.field_0);
            iVar20 = 2;
          }
          auVar95 = ZEXT1664(CONCAT412(0x219392ef,CONCAT48(0x219392ef,0x219392ef219392ef)));
          auVar97 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
          auVar98 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar41 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if (uVar21 < uVar18) goto LAB_005b3f9f;
        }
LAB_005b4329:
      } while (iVar20 != 3);
LAB_005b4556:
      auVar37 = vandps_avx(auVar40,(undefined1  [16])terminated.field_0);
      auVar40._8_4_ = 0xff800000;
      auVar40._0_8_ = 0xff800000ff800000;
      auVar40._12_4_ = 0xff800000;
      auVar37 = vmaskmovps_avx(auVar37,auVar40);
      *(undefined1 (*) [16])(ray + 0x80) = auVar37;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }